

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbd.c
# Opt level: O1

PF doscan(KEYMAP *map,int c,KEYMAP **newmap)

{
  PF p_Var1;
  KEYMAP *pKVar2;
  PF *pp_Var3;
  long lVar4;
  bool bVar5;
  
  ele = map->map_element;
  lVar4 = (long)map->map_num;
  bVar5 = 0 < lVar4;
  if (0 < lVar4) {
    if (map->map_element[0].k_num < c) {
      pKVar2 = map + 1;
      do {
        ele = (map_element *)pKVar2;
        bVar5 = ele < (KEYMAP *)(map->map_element + lVar4);
        if (!bVar5) goto LAB_0011208e;
        pKVar2 = (KEYMAP *)&((KEYMAP *)ele)->map_element[0].k_funcp;
      } while (((KEYMAP *)ele)->map_max < c);
    }
    if ((bVar5) && (((KEYMAP *)ele)->map_num <= c)) {
      pp_Var3 = (PF *)((long)((KEYMAP *)ele)->map_default + (long)(c - ((KEYMAP *)ele)->map_num) * 8
                      );
      goto LAB_00112092;
    }
  }
LAB_0011208e:
  pp_Var3 = &map->map_default;
LAB_00112092:
  p_Var1 = *pp_Var3;
  if ((newmap != (KEYMAP **)0x0) && (p_Var1 == (PF)0x0)) {
    *newmap = ele->k_prefmap;
  }
  return p_Var1;
}

Assistant:

PF
doscan(KEYMAP *map, int c, KEYMAP **newmap)
{
	struct map_element	*elec = &map->map_element[0];
	struct map_element	*last = &map->map_element[map->map_num];
	PF		 ret;

	while (elec < last && c > elec->k_num)
		elec++;

	/* used by prefix and binding code */
	ele = elec;
	if (elec >= last || c < elec->k_base)
		ret = map->map_default;
	else
		ret = elec->k_funcp[c - elec->k_base];
	if (ret == NULL && newmap != NULL)
		*newmap = elec->k_prefmap;

	return (ret);
}